

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchcompute_test.cc
# Opt level: O0

int main(void)

{
  test_delete_image();
  test_delete_job();
  test_delete_snapshot();
  test_get_image();
  test_get_job();
  test_get_job_description();
  test_get_snapshot();
  test_get_tasks();
  test_list_images();
  test_list_jobs();
  test_list_snapshots();
  test_post_job();
  test_put_job();
  test_release_job();
  test_start_job();
  test_stop_job();
  return 0;
}

Assistant:

int main() {
  test_delete_image();
  test_delete_job();
  test_delete_snapshot();
  test_get_image();
  test_get_job();
  test_get_job_description();
  test_get_snapshot();
  test_get_tasks();
  test_list_images();
  test_list_jobs();
  test_list_snapshots();
  test_post_job();
  test_put_job();
  test_release_job();
  test_start_job();
  test_stop_job();
}